

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ErrorCheckEndWindowRecover(ImGuiErrorLogCallback log_callback,void *user_data)

{
  ImGuiWindow *pIVar1;
  char *pcVar2;
  ImGuiContext *pIVar3;
  ImGuiWindowStackData *pIVar4;
  ImGuiColorMod *pIVar5;
  char *pcVar6;
  bool bVar7;
  ImGuiStackSizes *stack_sizes;
  ImGuiWindow *window;
  ImGuiContext *g;
  void *user_data_local;
  ImGuiErrorLogCallback log_callback_local;
  
  pIVar3 = GImGui;
  while( true ) {
    bVar7 = false;
    if ((pIVar3->CurrentTable != (ImGuiTable *)0x0) &&
       (bVar7 = true, pIVar3->CurrentTable->OuterWindow != pIVar3->CurrentWindow)) {
      bVar7 = pIVar3->CurrentTable->InnerWindow == pIVar3->CurrentWindow;
    }
    if (!bVar7) break;
    if (log_callback != (ImGuiErrorLogCallback)0x0) {
      (*log_callback)(user_data,"Recovered from missing EndTable() in \'%s\'",
                      pIVar3->CurrentTable->OuterWindow->Name);
    }
    EndTable();
  }
  pIVar1 = pIVar3->CurrentWindow;
  pIVar4 = ImVector<ImGuiWindowStackData>::back(&pIVar3->CurrentWindowStack);
  if (pIVar1 == (ImGuiWindow *)0x0) {
    __assert_fail("window != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui.cpp"
                  ,0x2226,"void ImGui::ErrorCheckEndWindowRecover(ImGuiErrorLogCallback, void *)");
  }
  while (pIVar3->CurrentTabBar != (ImGuiTabBar *)0x0) {
    if (log_callback != (ImGuiErrorLogCallback)0x0) {
      (*log_callback)(user_data,"Recovered from missing EndTabBar() in \'%s\'",pIVar1->Name);
    }
    EndTabBar();
  }
  while (0 < (pIVar1->DC).TreeDepth) {
    if (log_callback != (ImGuiErrorLogCallback)0x0) {
      (*log_callback)(user_data,"Recovered from missing TreePop() in \'%s\'",pIVar1->Name);
    }
    TreePop();
  }
  while ((int)(pIVar4->StackSizesOnBegin).SizeOfGroupStack < (pIVar3->GroupStack).Size) {
    if (log_callback != (ImGuiErrorLogCallback)0x0) {
      (*log_callback)(user_data,"Recovered from missing EndGroup() in \'%s\'",pIVar1->Name);
    }
    EndGroup();
  }
  while (1 < (pIVar1->IDStack).Size) {
    if (log_callback != (ImGuiErrorLogCallback)0x0) {
      (*log_callback)(user_data,"Recovered from missing PopID() in \'%s\'",pIVar1->Name);
    }
    PopID();
  }
  while ((pIVar4->StackSizesOnBegin).SizeOfDisabledStack < pIVar3->DisabledStackSize) {
    if (log_callback != (ImGuiErrorLogCallback)0x0) {
      (*log_callback)(user_data,"Recovered from missing EndDisabled() in \'%s\'",pIVar1->Name);
    }
    EndDisabled();
  }
  while ((int)(pIVar4->StackSizesOnBegin).SizeOfColorStack < (pIVar3->ColorStack).Size) {
    if (log_callback != (ImGuiErrorLogCallback)0x0) {
      pcVar2 = pIVar1->Name;
      pIVar5 = ImVector<ImGuiColorMod>::back(&pIVar3->ColorStack);
      pcVar6 = GetStyleColorName(pIVar5->Col);
      (*log_callback)(user_data,"Recovered from missing PopStyleColor() in \'%s\' for ImGuiCol_%s",
                      pcVar2,pcVar6);
    }
    PopStyleColor(1);
  }
  while ((int)(pIVar4->StackSizesOnBegin).SizeOfItemFlagsStack < (pIVar3->ItemFlagsStack).Size) {
    if (log_callback != (ImGuiErrorLogCallback)0x0) {
      (*log_callback)(user_data,"Recovered from missing PopItemFlag() in \'%s\'",pIVar1->Name);
    }
    PopItemFlag();
  }
  while ((int)(pIVar4->StackSizesOnBegin).SizeOfStyleVarStack < (pIVar3->StyleVarStack).Size) {
    if (log_callback != (ImGuiErrorLogCallback)0x0) {
      (*log_callback)(user_data,"Recovered from missing PopStyleVar() in \'%s\'",pIVar1->Name);
    }
    PopStyleVar(1);
  }
  while ((int)(pIVar4->StackSizesOnBegin).SizeOfFocusScopeStack < (pIVar3->FocusScopeStack).Size) {
    if (log_callback != (ImGuiErrorLogCallback)0x0) {
      (*log_callback)(user_data,"Recovered from missing PopFocusScope() in \'%s\'",pIVar1->Name);
    }
    PopFocusScope();
  }
  return;
}

Assistant:

void    ImGui::ErrorCheckEndWindowRecover(ImGuiErrorLogCallback log_callback, void* user_data)
{
    ImGuiContext& g = *GImGui;
    while (g.CurrentTable && (g.CurrentTable->OuterWindow == g.CurrentWindow || g.CurrentTable->InnerWindow == g.CurrentWindow))
    {
        if (log_callback) log_callback(user_data, "Recovered from missing EndTable() in '%s'", g.CurrentTable->OuterWindow->Name);
        EndTable();
    }

    ImGuiWindow* window = g.CurrentWindow;
    ImGuiStackSizes* stack_sizes = &g.CurrentWindowStack.back().StackSizesOnBegin;
    IM_ASSERT(window != NULL);
    while (g.CurrentTabBar != NULL) //-V1044
    {
        if (log_callback) log_callback(user_data, "Recovered from missing EndTabBar() in '%s'", window->Name);
        EndTabBar();
    }
    while (window->DC.TreeDepth > 0)
    {
        if (log_callback) log_callback(user_data, "Recovered from missing TreePop() in '%s'", window->Name);
        TreePop();
    }
    while (g.GroupStack.Size > stack_sizes->SizeOfGroupStack) //-V1044
    {
        if (log_callback) log_callback(user_data, "Recovered from missing EndGroup() in '%s'", window->Name);
        EndGroup();
    }
    while (window->IDStack.Size > 1)
    {
        if (log_callback) log_callback(user_data, "Recovered from missing PopID() in '%s'", window->Name);
        PopID();
    }
    while (g.DisabledStackSize > stack_sizes->SizeOfDisabledStack) //-V1044
    {
        if (log_callback) log_callback(user_data, "Recovered from missing EndDisabled() in '%s'", window->Name);
        EndDisabled();
    }
    while (g.ColorStack.Size > stack_sizes->SizeOfColorStack)
    {
        if (log_callback) log_callback(user_data, "Recovered from missing PopStyleColor() in '%s' for ImGuiCol_%s", window->Name, GetStyleColorName(g.ColorStack.back().Col));
        PopStyleColor();
    }
    while (g.ItemFlagsStack.Size > stack_sizes->SizeOfItemFlagsStack) //-V1044
    {
        if (log_callback) log_callback(user_data, "Recovered from missing PopItemFlag() in '%s'", window->Name);
        PopItemFlag();
    }
    while (g.StyleVarStack.Size > stack_sizes->SizeOfStyleVarStack) //-V1044
    {
        if (log_callback) log_callback(user_data, "Recovered from missing PopStyleVar() in '%s'", window->Name);
        PopStyleVar();
    }
    while (g.FocusScopeStack.Size > stack_sizes->SizeOfFocusScopeStack) //-V1044
    {
        if (log_callback) log_callback(user_data, "Recovered from missing PopFocusScope() in '%s'", window->Name);
        PopFocusScope();
    }
}